

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.cpp
# Opt level: O0

void CSound::RateConvert(int SampleID)

{
  int iVar1;
  CSample *pCVar2;
  short *psVar3;
  int in_EDI;
  int f;
  float a;
  int i;
  short *pNewData;
  int NumFrames;
  CSample *pSample;
  int local_2c;
  int local_24;
  
  pCVar2 = m_aSamples + in_EDI;
  if ((pCVar2->m_pData != (short *)0x0) && (m_aSamples[in_EDI].m_Rate != m_MixingRate)) {
    iVar1 = (int)(((float)m_aSamples[in_EDI].m_NumFrames / (float)m_aSamples[in_EDI].m_Rate) *
                 (float)m_MixingRate);
    psVar3 = (short *)mem_alloc(0);
    for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
      local_2c = (int)(((float)local_24 / (float)iVar1) * (float)m_aSamples[in_EDI].m_NumFrames);
      if (m_aSamples[in_EDI].m_NumFrames <= local_2c) {
        local_2c = m_aSamples[in_EDI].m_NumFrames + -1;
      }
      if (m_aSamples[in_EDI].m_Channels == 1) {
        psVar3[local_24] = pCVar2->m_pData[local_2c];
      }
      else if (m_aSamples[in_EDI].m_Channels == 2) {
        psVar3[local_24 << 1] = pCVar2->m_pData[local_2c << 1];
        psVar3[local_24 * 2 + 1] = pCVar2->m_pData[local_2c * 2 + 1];
      }
    }
    mem_free((void *)0x13e390);
    pCVar2->m_pData = psVar3;
    m_aSamples[in_EDI].m_NumFrames = iVar1;
  }
  return;
}

Assistant:

void CSound::RateConvert(int SampleID)
{
	CSample *pSample = &m_aSamples[SampleID];
	int NumFrames = 0;
	short *pNewData = 0;

	// make sure that we need to convert this sound
	if(!pSample->m_pData || pSample->m_Rate == m_MixingRate)
		return;

	// allocate new data
	NumFrames = (int)((pSample->m_NumFrames/(float)pSample->m_Rate)*m_MixingRate);
	pNewData = (short *)mem_alloc(NumFrames*pSample->m_Channels*sizeof(short));

	for(int i = 0; i < NumFrames; i++)
	{
		// resample TODO: this should be done better, like linear at least
		float a = i/(float)NumFrames;
		int f = (int)(a*pSample->m_NumFrames);
		if(f >= pSample->m_NumFrames)
			f = pSample->m_NumFrames-1;

		// set new data
		if(pSample->m_Channels == 1)
			pNewData[i] = pSample->m_pData[f];
		else if(pSample->m_Channels == 2)
		{
			pNewData[i*2] = pSample->m_pData[f*2];
			pNewData[i*2+1] = pSample->m_pData[f*2+1];
		}
	}

	// free old data and apply new
	mem_free(pSample->m_pData);
	pSample->m_pData = pNewData;
	pSample->m_NumFrames = NumFrames;
}